

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadCustom::LoadIntLoadResidual_F(ChLoadCustom *this,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  iVar4 = (*((this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChLoadable[8])();
  if (0 < iVar4) {
    iVar4 = 0;
    uVar10 = 0;
    do {
      peVar2 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar5 = (*peVar2->_vptr_ChLoadable[0xb])(peVar2,(ulong)uVar10);
      if ((char)iVar5 != '\0') {
        peVar2 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar5 = (*peVar2->_vptr_ChLoadable[9])(peVar2,(ulong)uVar10);
        peVar2 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar6 = (*peVar2->_vptr_ChLoadable[10])(peVar2,(ulong)uVar10);
        if (iVar6 != 0) {
          uVar11 = 0;
          do {
            uVar8 = (ulong)(uint)(iVar4 + (int)uVar11);
            if (((this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows <= (long)uVar8) ||
               (uVar9 = (ulong)(uint)(iVar5 + (int)uVar11),
               (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               <= (long)uVar9)) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 (this->load_Q).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[uVar8];
            pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = c;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = pdVar3[uVar9];
            auVar1 = vfmadd213sd_fma(auVar12,auVar13,auVar1);
            pdVar3[uVar9] = auVar1._0_8_;
            uVar11 = uVar11 + 1;
            peVar2 = (this->loadable).
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar7 = (*peVar2->_vptr_ChLoadable[10])(peVar2,(ulong)uVar10);
          } while (uVar11 < uVar7);
          iVar4 = iVar4 + (int)uVar11;
        }
      }
      uVar10 = uVar10 + 1;
      iVar5 = (*((this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ChLoadable[8])();
    } while ((int)uVar10 < iVar5);
  }
  return;
}

Assistant:

void ChLoadCustom::LoadIntLoadResidual_F(ChVectorDynamic<>& R, const double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < loadable->GetSubBlocks(); ++i) {
        if (loadable->IsSubBlockActive(i)) {
            unsigned int moffset = loadable->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < loadable->GetSubBlockSize(i); ++row) {
                R(row + moffset) += load_Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}